

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_case.cpp
# Opt level: O3

void duckdb::TemplatedFillLoop<int>(Vector *vector,Vector *result,SelectionVector *sel,sel_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var5;
  sel_t *psVar6;
  byte bVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  SelectionVector *pSVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  ulong uVar12;
  _Head_base<0UL,_unsigned_long_*,_false> _Var13;
  ulong uVar14;
  ulong uVar15;
  UnifiedVectorFormat vdata;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  Vector::SetVectorType(result,FLAT_VECTOR);
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (vector->vector_type == CONSTANT_VECTOR) {
    pdVar2 = vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
      if (count != 0) {
        psVar6 = sel->sel_vector;
        uVar15 = 0;
        do {
          uVar12 = uVar15;
          if (psVar6 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar6[uVar15];
          }
          *(undefined4 *)(pdVar1 + uVar12 * 4) = *(undefined4 *)pdVar2;
          uVar15 = uVar15 + 1;
        } while (count != uVar15);
      }
    }
    else if (count != 0) {
      uVar15 = 0;
      do {
        uVar12 = uVar15;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar12 = (ulong)sel->sel_vector[uVar15];
        }
        _Var13._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var13._M_head_impl == (unsigned_long *)0x0) {
          local_98 = (element_type *)
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,(unsigned_long *)&local_98);
          pdVar1 = local_78.data;
          pSVar10 = local_78.sel;
          local_78.sel = (SelectionVector *)0x0;
          local_78.data = (data_ptr_t)0x0;
          p_Var4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar10;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar1;
          if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
          }
          pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var13._M_head_impl =
               (pTVar11->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var13._M_head_impl;
        }
        bVar7 = (byte)uVar12 & 0x3f;
        _Var13._M_head_impl[uVar12 >> 6] =
             _Var13._M_head_impl[uVar12 >> 6] & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7)
        ;
        uVar15 = uVar15 + 1;
      } while (count != uVar15);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,(ulong)count,&local_78);
    if (count != 0) {
      local_88 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar15 = 0;
      do {
        _Var5._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        uVar12 = uVar15;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Var5._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar12 = (ulong)*(uint *)((long)_Var5._M_t.
                                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                          .super__Head_base<0UL,_unsigned_long_*,_false>.
                                          _M_head_impl + uVar15 * 4);
        }
        uVar14 = uVar15;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)sel->sel_vector[uVar15];
        }
        *(undefined4 *)(pdVar1 + uVar14 * 4) =
             *(undefined4 *)((long)(_func_int ***)local_78.data + uVar12 * 4);
        if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          _Var13._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
LAB_00ea280d:
          if (_Var13._M_head_impl != (unsigned_long *)0x0) {
            _Var13._M_head_impl[uVar14 >> 6] =
                 _Var13._M_head_impl[uVar14 >> 6] | 1L << ((byte)uVar14 & 0x3f);
          }
        }
        else {
          _Var13._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0) goto LAB_00ea280d;
          if (_Var13._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var9 = p_Stack_90;
            peVar8 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar8;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var9;
            if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_88);
            _Var13._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var13._M_head_impl;
          }
          bVar7 = (byte)uVar14 & 0x3f;
          _Var13._M_head_impl[uVar14 >> 6] =
               _Var13._M_head_impl[uVar14 >> 6] &
               (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        }
        uVar15 = uVar15 + 1;
      } while (count != uVar15);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void TemplatedFillLoop(Vector &vector, Vector &result, const SelectionVector &sel, sel_t count) {
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto res = FlatVector::GetData<T>(result);
	auto &result_mask = FlatVector::Validity(result);
	if (vector.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto data = ConstantVector::GetData<T>(vector);
		if (ConstantVector::IsNull(vector)) {
			for (idx_t i = 0; i < count; i++) {
				result_mask.SetInvalid(sel.get_index(i));
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				res[sel.get_index(i)] = *data;
			}
		}
	} else {
		UnifiedVectorFormat vdata;
		vector.ToUnifiedFormat(count, vdata);
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = vdata.sel->get_index(i);
			auto res_idx = sel.get_index(i);

			res[res_idx] = data[source_idx];
			result_mask.Set(res_idx, vdata.validity.RowIsValid(source_idx));
		}
	}
}